

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadV128(BinaryReader *this,v128 *out_value,char *desc)

{
  Result RVar1;
  char *desc_local;
  v128 *out_value_local;
  BinaryReader *this_local;
  
  RVar1 = ReadT<v128>(this,out_value,"v128",desc);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReader::ReadV128(v128* out_value, const char* desc) {
  return ReadT(out_value, "v128", desc);
}